

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

string * Potassco::ProgramOptions::quote(string *__return_storage_ptr__,string *x)

{
  char *pcVar1;
  string *psVar2;
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"\'",&local_39);
  pcVar1 = (char *)std::__cxx11::string::append(local_38);
  psVar2 = (string *)std::__cxx11::string::append(pcVar1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string quote(const std::string& x) {
	return std::string("'").append(x).append("'");
}